

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * duckdb_je_malloc_default(size_t size)

{
  cache_bin_stats_t *pcVar1;
  ulong uVar2;
  void **ppvVar3;
  uint64_t uVar4;
  void **ppvVar5;
  bool bVar6;
  _Bool _Var7;
  char cVar8;
  szind_t sVar9;
  tsd_t *tsd;
  int *piVar10;
  arena_t *paVar11;
  void *pvVar12;
  void *__s;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  tcache_t *ptVar16;
  long lVar17;
  cache_bin_t *pcVar18;
  uintptr_t args [3];
  te_ctx_t local_68;
  void *local_38;
  
  tsd = (tsd_t *)__tls_get_addr();
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  if ((tsd->state).repr != '\0') {
    if ((duckdb_je_malloc_init_state != malloc_init_initialized) &&
       (_Var7 = malloc_init_hard(), _Var7)) goto LAB_01d83d72;
    _Var7 = duckdb_je_opt_zero;
    if (size < 0x1001) {
      uVar13 = (ulong)duckdb_je_sz_size2index_tab[size + 7 >> 3];
    }
    else {
      sVar9 = sz_size2index_compute(size);
      uVar13 = (ulong)sVar9;
    }
    uVar15 = (uint)uVar13;
    if (uVar15 < 0xe8) {
      uVar2 = duckdb_je_sz_index2size_tab[uVar13];
      lVar17 = 0xffffffff;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        ptVar16 = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        lVar17 = 0;
        ptVar16 = (tcache_t *)0x0;
      }
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        paVar11 = (arena_t *)0x0;
LAB_01d8406a:
        bVar6 = false;
      }
      else {
        paVar11 = (arena_t *)duckdb_je_arenas[lVar17].repr;
        if (paVar11 == (arena_t *)0x0) {
          paVar11 = duckdb_je_arena_init((tsdn_t *)tsd,(uint)lVar17,&duckdb_je_arena_config_default)
          ;
        }
        if (paVar11 != (arena_t *)0x0) goto LAB_01d8406a;
        bVar6 = duckdb_je_narenas_auto <= (uint)lVar17;
      }
      if (bVar6) {
        __s = (void *)0x0;
      }
      else if (ptVar16 == (tcache_t *)0x0) {
LAB_01d8431a:
        __s = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,paVar11,size,uVar15,_Var7,uVar2 < 0x3801);
      }
      else if (uVar2 < 0x3801) {
        pcVar18 = ptVar16->bins + uVar13;
        ppvVar3 = pcVar18->stack_head;
        pvVar12 = *ppvVar3;
        ppvVar5 = ppvVar3 + 1;
        if (pcVar18->low_bits_low_water == (uint16_t)ppvVar3) {
          if (pcVar18->low_bits_empty != (uint16_t)ppvVar3) {
            pcVar18->stack_head = ppvVar5;
            pcVar18->low_bits_low_water = (uint16_t)ppvVar5;
            goto LAB_01d840b2;
          }
          bVar6 = false;
          pvVar12 = (void *)0x0;
        }
        else {
          pcVar18->stack_head = ppvVar5;
LAB_01d840b2:
          bVar6 = true;
        }
        if (!bVar6) {
          local_38 = pvVar12;
          paVar11 = arena_choose(tsd,paVar11);
          if (paVar11 == (arena_t *)0x0) {
            cVar8 = '\0';
LAB_01d843d5:
            __s = (void *)0x0;
          }
          else {
            if (pcVar18->stack_head != (void **)&duckdb_je_disabled_bin) {
              duckdb_je_tcache_bin_flush_stashed(tsd,ptVar16,pcVar18,uVar15,true);
              local_38 = duckdb_je_tcache_alloc_small_hard
                                   ((tsdn_t *)tsd,paVar11,ptVar16,pcVar18,uVar15,&local_68.is_alloc)
              ;
              cVar8 = local_68.is_alloc;
              goto LAB_01d843d5;
            }
            __s = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,paVar11,size,uVar15,_Var7,true);
            cVar8 = '\0';
          }
          pvVar12 = local_38;
          if (cVar8 == '\0') goto LAB_01d840cb;
        }
        if (_Var7 != false) {
          switchD_01306cb1::default(pvVar12,0,duckdb_je_sz_index2size_tab[uVar13]);
        }
        (pcVar18->tstats).nrequests = (pcVar18->tstats).nrequests + 1;
        __s = pvVar12;
      }
      else {
        if ((ptVar16->tcache_slow->tcache_nbins <= uVar15) ||
           (ppvVar5 = ptVar16->bins[uVar13].stack_head, ppvVar5 == (void **)&duckdb_je_disabled_bin)
           ) goto LAB_01d8431a;
        pcVar18 = ptVar16->bins + uVar13;
        __s = *ppvVar5;
        ppvVar3 = ppvVar5 + 1;
        if (pcVar18->low_bits_low_water == (uint16_t)ppvVar5) {
          if (pcVar18->low_bits_empty != (uint16_t)ppvVar5) {
            pcVar18->stack_head = ppvVar3;
            pcVar18->low_bits_low_water = (uint16_t)ppvVar3;
            goto LAB_01d842f3;
          }
          bVar6 = false;
          __s = (void *)0x0;
        }
        else {
          pcVar18->stack_head = ppvVar3;
LAB_01d842f3:
          bVar6 = true;
        }
        if (bVar6) {
          if (_Var7 != false) {
            switchD_01306cb1::default(__s,0,duckdb_je_sz_index2size_tab[uVar13]);
          }
          (pcVar18->tstats).nrequests = (pcVar18->tstats).nrequests + 1;
        }
        else {
          paVar11 = arena_choose(tsd,paVar11);
          if (paVar11 == (arena_t *)0x0) {
            __s = (void *)0x0;
          }
          else {
            duckdb_je_tcache_bin_flush_stashed(tsd,ptVar16,pcVar18,uVar15,false);
            if (size < 0x1001) {
              sVar14 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
            }
            else if (size < 0x7000000000000001) {
              uVar13 = size * 2 - 1;
              lVar17 = 0x3f;
              if (uVar13 != 0) {
                for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
                }
              }
              uVar13 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
              sVar14 = ~uVar13 + size & uVar13;
            }
            else {
              sVar14 = 0;
            }
            __s = duckdb_je_large_malloc((tsdn_t *)tsd,paVar11,sVar14,_Var7);
          }
        }
      }
LAB_01d840cb:
      if (__s != (void *)0x0) {
        local_68.is_alloc = true;
        local_68.current =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
        local_68.last_event =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event
        ;
        local_68.next_event =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event
        ;
        local_68.next_event_fast =
             &tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast
        ;
        uVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
        tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar4 + uVar2;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
            uVar4 <= uVar2) {
          duckdb_je_te_event_trigger(tsd,&local_68);
        }
        bVar6 = true;
        if ((_Var7 == false) && (duckdb_je_opt_junk_alloc == true)) {
          switchD_01306cb1::default(__s,0xa5,uVar2);
        }
        goto LAB_01d83e35;
      }
    }
    piVar10 = __errno_location();
    *piVar10 = 0xc;
    bVar6 = true;
    __s = (void *)0x0;
    goto LAB_01d83e35;
  }
  if (size < 0x1001) {
    uVar13 = (ulong)duckdb_je_sz_size2index_tab[size + 7 >> 3];
  }
  else {
    sVar9 = sz_size2index_compute(size);
    uVar13 = (ulong)sVar9;
  }
  uVar15 = (uint)uVar13;
  if (uVar15 < 0xe8) {
    uVar2 = duckdb_je_sz_index2size_tab[uVar13];
    ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    if (uVar2 < 0x3801) {
      pcVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar13;
      ppvVar3 = pcVar18->stack_head;
      pvVar12 = *ppvVar3;
      ppvVar5 = ppvVar3 + 1;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
          low_bits_low_water == (uint16_t)ppvVar3) {
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
            low_bits_empty != (uint16_t)ppvVar3) {
          pcVar18->stack_head = ppvVar5;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
          low_bits_low_water = (uint16_t)ppvVar5;
          goto LAB_01d83dc7;
        }
        bVar6 = false;
        pvVar12 = (void *)0x0;
      }
      else {
        pcVar18->stack_head = ppvVar5;
LAB_01d83dc7:
        bVar6 = true;
      }
      if (!bVar6) {
        __s = (void *)0x0;
        paVar11 = arena_choose(tsd,(arena_t *)0x0);
        if (paVar11 == (arena_t *)0x0) {
LAB_01d84278:
          cVar8 = '\0';
        }
        else {
          if (pcVar18->stack_head == (void **)&duckdb_je_disabled_bin) {
            __s = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,paVar11,size,uVar15,false,true);
            goto LAB_01d84278;
          }
          duckdb_je_tcache_bin_flush_stashed(tsd,ptVar16,pcVar18,uVar15,true);
          pvVar12 = duckdb_je_tcache_alloc_small_hard
                              ((tsdn_t *)tsd,paVar11,ptVar16,pcVar18,uVar15,&local_68.is_alloc);
          __s = (void *)0x0;
          cVar8 = local_68.is_alloc;
        }
        if (cVar8 == '\0') goto LAB_01d83dd8;
      }
      __s = pvVar12;
      pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
                tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
    }
    else if ((uVar15 < ptVar16->tcache_slow->tcache_nbins) &&
            (ppvVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                       [uVar13].stack_head, ppvVar5 != (void **)&duckdb_je_disabled_bin)) {
      pcVar18 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar13;
      __s = *ppvVar5;
      ppvVar3 = ppvVar5 + 1;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
          low_bits_low_water == (uint16_t)ppvVar5) {
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
            low_bits_empty != (uint16_t)ppvVar5) {
          pcVar18->stack_head = ppvVar3;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
          low_bits_low_water = (uint16_t)ppvVar3;
          goto LAB_01d83f69;
        }
        bVar6 = false;
        __s = (void *)0x0;
      }
      else {
        pcVar18->stack_head = ppvVar3;
LAB_01d83f69:
        bVar6 = true;
      }
      if (bVar6) {
        pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar13].
                  tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
      }
      else {
        __s = (void *)0x0;
        paVar11 = arena_choose(tsd,(arena_t *)0x0);
        if (paVar11 != (arena_t *)0x0) {
          duckdb_je_tcache_bin_flush_stashed(tsd,ptVar16,pcVar18,uVar15,false);
          if (size < 0x1001) {
            sVar14 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
          }
          else if (size < 0x7000000000000001) {
            uVar13 = size * 2 - 1;
            lVar17 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
              }
            }
            uVar13 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
            sVar14 = ~uVar13 + size & uVar13;
          }
          else {
            sVar14 = 0;
          }
          __s = duckdb_je_large_malloc((tsdn_t *)tsd,paVar11,sVar14,false);
        }
      }
    }
    else {
      __s = duckdb_je_arena_malloc_hard
                      ((tsdn_t *)tsd,(arena_t *)0x0,size,uVar15,false,uVar2 < 0x3801);
    }
LAB_01d83dd8:
    if (__s == (void *)0x0) goto LAB_01d83d72;
    local_68.is_alloc = true;
    local_68.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
    local_68.last_event =
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
    local_68.next_event =
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
    local_68.next_event_fast =
         &tsd->
          cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
    uVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar4 + uVar2;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
        uVar4 <= uVar2) {
      duckdb_je_te_event_trigger(tsd,&local_68);
    }
  }
  else {
LAB_01d83d72:
    piVar10 = __errno_location();
    *piVar10 = 0xc;
    __s = (void *)0x0;
  }
  bVar6 = false;
LAB_01d83e35:
  if (bVar6) {
    local_68.current = (uint64_t *)0x0;
    local_68.last_event = (uint64_t *)0x0;
    local_68._0_8_ = size;
    duckdb_je_hook_invoke_alloc(hook_alloc_malloc,__s,(uintptr_t)__s,(uintptr_t *)&local_68);
  }
  return __s;
}

Assistant:

JEMALLOC_NOINLINE
void *
malloc_default(size_t size) {
	void *ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	/*
	 * This variant has logging hook on exit but not on entry.  It's callled
	 * only by je_malloc, below, which emits the entry one for us (and, if
	 * it calls us, does so only via tail call).
	 */

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.null_out_result_on_error = true;
	sopts.set_errno_on_error = true;
	sopts.oom_string = "<jemalloc>: Error in malloc(): out of memory\n";

	dopts.result = &ret;
	dopts.num_items = 1;
	dopts.item_size = size;

	imalloc(&sopts, &dopts);
	/*
	 * Note that this branch gets optimized away -- it immediately follows
	 * the check on tsd_fast that sets sopts.slow.
	 */
	if (sopts.slow) {
		uintptr_t args[3] = {size};
		hook_invoke_alloc(hook_alloc_malloc, ret, (uintptr_t)ret, args);
	}

	return ret;
}